

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveImmToStackArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Imm *imm_)

{
  uint *puVar1;
  uint uVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  Error EVar8;
  uint *in_RCX;
  uint *in_RDX;
  long *in_RDI;
  Error _err;
  uint32_t i;
  uint32_t movCount;
  Imm imm [2];
  Mem stackPtr;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *in_stack_fffffffffffff9c0;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *in_stack_fffffffffffff9c8;
  bool local_621;
  uint *local_5b8;
  uint local_5a4;
  uint local_5a0;
  uint local_59c;
  uint local_598 [4];
  uint local_588 [2];
  uint local_580;
  undefined4 local_57c;
  uint auStack_578 [2];
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  int local_564;
  uint *local_560;
  uint *local_558;
  undefined1 local_550 [32];
  uint *local_530;
  undefined4 local_524;
  undefined4 *local_520;
  undefined4 local_514;
  undefined4 *local_510;
  undefined1 *local_508;
  undefined4 local_4fc;
  undefined4 local_4f8;
  int local_4f4;
  uint *local_4f0;
  undefined4 *local_4e8;
  uint *local_4e0;
  uint *local_4d0;
  long local_4c8;
  uint *local_4c0;
  byte local_4b1;
  uint *local_4b0;
  long local_4a8;
  uint *local_4a0;
  ushort local_492;
  uint *local_490;
  uint *local_488;
  uint *local_480;
  undefined4 local_474;
  uint *local_470;
  uint *local_468;
  uint *local_460;
  uint *local_458;
  uint *local_450;
  uint *local_448;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *local_440;
  uint *local_438;
  uint local_42c;
  undefined4 *local_428;
  undefined4 *local_420;
  undefined4 *local_418;
  undefined4 local_40c;
  undefined4 local_3fc;
  undefined4 local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  undefined4 *local_3e8;
  uint *local_3e0;
  undefined4 local_3d4;
  undefined4 *local_3d0;
  undefined4 local_3c4;
  undefined4 *local_3c0;
  undefined4 local_3b8;
  uint local_3b4 [3];
  uint local_3a8;
  uint local_3a4 [3];
  uint *local_398;
  undefined4 *local_390;
  undefined4 local_384;
  uint *local_380;
  uint *local_378;
  uint *local_370;
  byte local_365;
  uint local_364;
  uint *local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 *local_350;
  uint *local_348;
  uint local_33c;
  undefined4 *local_338;
  uint *local_330;
  uint local_324;
  uint *local_320;
  uint *local_318;
  uint local_30c;
  undefined4 local_308;
  undefined4 local_304;
  long *local_300;
  uint *local_2f8;
  long *local_2f0;
  uint *local_2e8;
  uint *local_2e0;
  uint *local_2d8;
  undefined4 local_2cc;
  long local_2c8;
  uint *local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  uint *local_2a8;
  undefined4 local_29c;
  ulong local_298;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *local_290;
  long *local_288;
  long *local_280;
  undefined4 local_274;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *local_270;
  undefined4 local_264;
  uint *local_260;
  undefined4 local_254;
  char *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  char *in_stack_fffffffffffffdc0;
  undefined1 local_1f1;
  undefined1 *local_1f0;
  byte *local_1e8;
  uint *local_1e0;
  undefined4 local_1d4;
  ulong local_1d0;
  uint *local_1c8;
  undefined4 local_1bc;
  uint *local_1b8;
  undefined4 local_1ac;
  uint *local_1a8;
  uint *local_1a0;
  uint *local_198;
  byte *local_190;
  byte *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined1 local_169;
  undefined1 *local_168;
  uint *local_160;
  uint *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined2 local_13a;
  undefined2 *local_138;
  ushort *local_130;
  uint *local_128;
  undefined4 local_11c;
  ulong local_118;
  uint *local_110;
  undefined4 local_104;
  uint *local_100;
  undefined4 local_f4;
  uint *local_f0;
  uint *local_e8;
  uint *local_e0;
  ushort *local_d8;
  ushort *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined2 local_b2;
  undefined2 *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  long local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  long *local_58;
  int local_4c;
  undefined4 local_48;
  undefined4 local_44;
  uint *local_40;
  undefined4 *local_38;
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint *local_20;
  undefined4 *local_18;
  uint *local_10;
  uint *local_8;
  
  local_508 = local_550;
  local_40c = 0x200;
  local_560 = in_RCX;
  local_558 = in_RDX;
  bVar7 = Support::test<unsigned_int,unsigned_int>(*in_RDX,0x200);
  if (!bVar7) {
    DebugUtils::assertionFailed
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
  }
  local_4f0 = (uint *)(*in_RDI + 0x1d8);
  local_4d0 = local_558;
  local_4f4 = (int)*local_558 >> 0xc;
  local_4e8 = &local_570;
  local_4f8 = 0;
  local_4fc = 0;
  local_384 = 0;
  local_390 = &local_570;
  local_3a4[1] = 0;
  local_358 = 2;
  local_354 = 2;
  local_3b4[1] = 2;
  local_365 = (byte)(*local_4f0 >> 3) & 0x1f;
  local_3b4[0] = (uint)local_365 << 3;
  local_318 = local_3b4 + 1;
  local_320 = local_3b4;
  local_3b4[2] = local_3b4[0] | 2;
  local_308 = 0;
  local_3b8 = 0;
  local_330 = local_3b4 + 2;
  local_338 = &local_3b8;
  local_348 = &local_3a8;
  local_350 = &local_384;
  local_44 = *(undefined4 *)(*in_RDI + 0x1dc);
  local_40 = local_3a4;
  local_48 = 0;
  local_28 = 0;
  local_568 = 0;
  local_5b8 = local_598;
  local_4e0 = local_4f0;
  local_3a8 = local_3b4[2];
  local_3a4[0] = local_3b4[2];
  local_3a4[2] = local_4f4;
  local_398 = local_4f0;
  local_380 = local_4f0;
  local_378 = local_4f0;
  local_370 = local_4f0;
  local_364 = local_3b4[0];
  local_360 = local_4f0;
  local_33c = local_3b4[2];
  local_324 = local_3b4[2];
  local_30c = local_3b4[2];
  local_304 = local_3b8;
  local_4c = local_4f4;
  local_38 = local_390;
  local_2c = local_4f4;
  local_24 = local_44;
  local_20 = local_40;
  local_18 = local_390;
  local_570 = local_3b4[2];
  local_56c = local_44;
  local_564 = local_4f4;
  do {
    local_470 = local_5b8;
    local_3fc = 4;
    local_3f8 = 4;
    local_474 = 4;
    local_3e0 = local_5b8;
    local_3e8 = &local_474;
    local_3ec = 0;
    local_3f0 = 0;
    local_3f4 = 0;
    *local_5b8 = 4;
    local_5b8[1] = local_3ec;
    local_5b8[2] = local_3f0;
    local_5b8[3] = local_3f4;
    uVar6 = local_570;
    local_5b8 = local_5b8 + 4;
  } while (local_5b8 != auStack_578);
  local_510 = &local_570;
  local_514 = 4;
  local_3d4 = 4;
  local_570 = CONCAT13(4,(undefined3)local_570);
  local_460 = local_598;
  local_468 = local_560;
  local_98 = local_560;
  local_598[0] = *local_560;
  local_598[1] = local_560[1];
  puVar1 = local_560 + 2;
  local_598[2] = *puVar1;
  uVar2 = local_560[3];
  lVar5 = *(long *)puVar1;
  local_59c = 0;
  local_530 = local_558;
  bVar3 = (byte)local_598[2];
  uVar4 = (ushort)local_598[2];
  local_3d0 = local_510;
  local_90 = local_460;
  local_598[3] = uVar2;
  switch((char)*local_558) {
  case '\"':
    local_4c0 = local_598;
    local_1f1 = 1;
    local_1f0 = &local_1f1;
    local_4c8 = (long)(char)bVar3;
    local_2f0 = &local_4c8;
    local_2cc = 0;
    local_254 = 0;
    local_598[0] = local_598[0] & 0xfffffff7;
    local_598[2] = (uint)(char)bVar3;
    local_2e8 = local_4c0;
    local_2e0 = local_4c0;
    local_2d8 = local_4c0;
    local_2c8 = local_4c8;
    local_2c0 = local_4c0;
    local_288 = local_2f0;
    break;
  case '#':
    local_4b0 = local_598;
    local_169 = 1;
    local_168 = &local_169;
    local_1e8 = &local_4b1;
    local_1d0 = (ulong)bVar3;
    local_1d4 = 0;
    local_1bc = 0;
    local_1ac = 0;
    local_598[0] = local_598[0] & 0xfffffff7;
    local_598[2] = local_598[2] & 0xff;
    local_4b1 = bVar3;
    local_1e0 = local_4b0;
    local_1c8 = local_4b0;
    local_1b8 = local_4b0;
    local_1a8 = local_4b0;
    local_1a0 = local_4b0;
    local_198 = local_4b0;
    local_190 = local_1e8;
    local_188 = local_1e8;
    local_180 = *(undefined8 *)puVar1;
    local_178 = *(undefined8 *)puVar1;
    break;
  case '$':
    local_4a0 = local_598;
    local_13a = 1;
    local_138 = &local_13a;
    local_4a8 = (long)(short)uVar4;
    local_300 = &local_4a8;
    local_2b4 = 0;
    local_264 = 0;
    local_598[0] = local_598[0] & 0xfffffff7;
    local_598[2] = (uint)(short)uVar4;
    local_2f8 = local_4a0;
    local_2b0 = local_4a8;
    local_2a8 = local_4a0;
    local_280 = local_300;
    local_260 = local_4a0;
    local_160 = local_4a0;
    local_158 = local_4a0;
    local_150 = *(undefined8 *)puVar1;
    local_148 = *(undefined8 *)puVar1;
    break;
  case '%':
    local_490 = local_598;
    local_b2 = 1;
    local_b0 = &local_b2;
    local_130 = &local_492;
    local_118 = (ulong)uVar4;
    local_11c = 0;
    local_104 = 0;
    local_f4 = 0;
    local_598[0] = local_598[0] & 0xfffffff7;
    local_598[2] = local_598[2] & 0xffff;
    local_492 = uVar4;
    local_128 = local_490;
    local_110 = local_490;
    local_100 = local_490;
    local_f0 = local_490;
    local_e8 = local_490;
    local_e0 = local_490;
    local_d8 = local_130;
    local_d0 = local_130;
    local_c8 = *(undefined8 *)puVar1;
    local_c0 = *(undefined8 *)puVar1;
    break;
  case '&':
  case '\'':
  case '*':
    break;
  case '(':
  case ')':
  case '+':
  case '1':
  case '2':
    if ((*(byte *)((long)in_RDI + 0x291) & 1) != 0) {
      local_458 = local_598;
      local_621 = false;
      if ((local_598[0] >> 3 & 1) == 0) {
        local_80 = 0xffffffff80000000;
        local_88 = 0x7fffffff;
        local_58 = &local_78;
        local_60 = &local_80;
        local_68 = &local_88;
        local_621 = -0x80000001 < lVar5 && lVar5 < 0x80000000;
        local_450 = local_458;
        local_78 = lVar5;
        local_70 = lVar5;
      }
      local_a8 = local_458;
      local_a0 = local_458;
      if (local_621) {
        local_520 = &local_570;
        local_524 = 8;
        local_3c4 = 8;
        local_570 = uVar6 & 0xffffff | 0x8000000;
        local_59c = 1;
        local_3c0 = local_520;
        goto LAB_001f481c;
      }
    }
    in_stack_fffffffffffff9c0 = (EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)local_588;
    local_438 = local_598;
    local_448 = &local_5a0;
    local_298 = (ulong)uVar2;
    local_29c = 0;
    local_274 = 0;
    local_588[0] = local_588[0] & 0xfffffff7;
    local_57c = 0;
    local_488 = local_598;
    local_598[3] = 0;
    local_59c = 2;
    in_stack_fffffffffffff9c8 = in_stack_fffffffffffff9c0;
    local_5a0 = uVar2;
    local_440 = in_stack_fffffffffffff9c0;
    local_290 = in_stack_fffffffffffff9c0;
    local_270 = in_stack_fffffffffffff9c0;
    local_10 = local_448;
    local_8 = local_448;
    local_580 = uVar2;
    goto LAB_001f481c;
  default:
    EVar8 = DebugUtils::errored(0x19);
    return EVar8;
  }
  local_480 = local_598;
  local_598[3] = 0;
  local_59c = 1;
LAB_001f481c:
  local_5a4 = 0;
  while( true ) {
    if (local_59c <= local_5a4) {
      return 0;
    }
    EVar8 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::mov
                      (in_stack_fffffffffffff9c8,(Mem *)in_stack_fffffffffffff9c0,
                       (Imm *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    if (EVar8 != 0) break;
    local_420 = &local_570;
    local_42c = local_570 >> 0x18;
    local_428 = &local_570;
    local_564 = local_42c + local_564;
    local_5a4 = local_5a4 + 1;
    in_stack_fffffffffffff9bc = 0;
    local_418 = local_420;
  }
  return EVar8;
}

Assistant:

Error RACFGBuilder::moveImmToStackArg(InvokeNode* invokeNode, const FuncValue& arg, const Imm& imm_) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isStack());

  Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
  Imm imm[2];

  stackPtr.setSize(4);
  imm[0] = imm_;
  uint32_t movCount = 0;

  // One stack entry has the same size as the native register size. That means that if we want to move a 32-bit
  // integer on the stack in 64-bit mode, we need to extend it to a 64-bit integer first. In 32-bit mode, pushing
  // a 64-bit on stack is done in two steps by pushing low and high parts separately.
  switch (arg.typeId()) {
    case TypeId::kInt8: imm[0].signExtend8Bits(); goto MovU32;
    case TypeId::kUInt8: imm[0].zeroExtend8Bits(); goto MovU32;
    case TypeId::kInt16: imm[0].signExtend16Bits(); goto MovU32;
    case TypeId::kUInt16: imm[0].zeroExtend16Bits(); goto MovU32;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kFloat32:
MovU32:
      imm[0].zeroExtend32Bits();
      movCount = 1;
      break;

    case TypeId::kInt64:
    case TypeId::kUInt64:
    case TypeId::kFloat64:
    case TypeId::kMmx32:
    case TypeId::kMmx64:
      if (_is64Bit && imm[0].isInt32()) {
        stackPtr.setSize(8);
        movCount = 1;
        break;
      }

      imm[1].setValue(imm[0].uint32Hi());
      imm[0].zeroExtend32Bits();
      movCount = 2;
      break;

    default:
      return DebugUtils::errored(kErrorInvalidAssignment);
  }

  for (uint32_t i = 0; i < movCount; i++) {
    ASMJIT_PROPAGATE(cc()->mov(stackPtr, imm[i]));
    stackPtr.addOffsetLo32(int32_t(stackPtr.size()));
  }

  return kErrorOk;
}